

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O3

void lws_close_reason(lws *wsi,lws_close_status status,uchar *buf,size_t len)

{
  _lws_websocket_related *p_Var1;
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  
  if (wsi->role_ops == &role_ops_ws) {
    p_Var1 = wsi->ws;
    *(ushort *)(p_Var1->ping_payload_buf + 0x10) = (ushort)status << 8 | (ushort)status >> 8;
    puVar2 = p_Var1->ping_payload_buf + 0x12;
    if (len != 0 && buf != (uchar *)0x0) {
      uVar4 = 0x7a;
      if (len - 1 < 0x7a) {
        uVar4 = len - 1;
      }
      lVar3 = 0;
      do {
        puVar2[lVar3] = buf[lVar3];
        lVar3 = lVar3 + 1;
      } while (uVar4 + 1 != lVar3);
      puVar2 = puVar2 + lVar3;
    }
    wsi->ws->close_in_ping_buffer_len = (char)puVar2 - ((char)p_Var1 + '\x18');
    return;
  }
  __assert_fail("lwsi_role_ws(wsi)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                ,0x394,
                "void lws_close_reason(struct lws *, enum lws_close_status, unsigned char *, size_t)"
               );
}

Assistant:

void
lws_close_reason(struct lws *wsi, enum lws_close_status status,
		 unsigned char *buf, size_t len)
{
	unsigned char *p, *start;
	int budget = sizeof(wsi->ws->ping_payload_buf) - LWS_PRE;

	assert(lwsi_role_ws(wsi));

	start = p = &wsi->ws->ping_payload_buf[LWS_PRE];

	*p++ = (((int)status) >> 8) & 0xff;
	*p++ = ((int)status) & 0xff;

	if (buf)
		while (len-- && p < start + budget)
			*p++ = *buf++;

	wsi->ws->close_in_ping_buffer_len = lws_ptr_diff(p, start);
}